

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcp_dial_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x588));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0x570));
    if (iVar1 != 0) {
      nni_aio_abort((nni_aio *)((long)arg + 0x3a8),NNG_ECANCELED);
      nni_aio_abort((nni_aio *)((long)arg + 0x1e0),NNG_ECANCELED);
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
  return;
}

Assistant:

static void
tcp_dial_cancel(nni_aio *aio, void *arg, int rv)
{
	tcp_dialer *d = arg;

	nni_mtx_lock(&d->mtx);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);

		if (nni_list_empty(&d->conaios)) {
			nni_aio_abort(&d->conaio, NNG_ECANCELED);
			nni_aio_abort(&d->resaio, NNG_ECANCELED);
		}
	}
	nni_mtx_unlock(&d->mtx);
}